

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

uint32 __thiscall Js::RecyclableArrayWalker::GetChildrenCount(RecyclableArrayWalker *this)

{
  bool bVar1;
  uint32 uVar2;
  uint32 uVar3;
  JavascriptArray *arrayObj;
  
  bVar1 = JavascriptArray::IsNonES5Array((this->super_RecyclableObjectWalker).instance);
  if ((!bVar1) &&
     (bVar1 = VarIs<Js::ES5Array>((this->super_RecyclableObjectWalker).instance), !bVar1)) {
    return 0;
  }
  uVar2 = 0;
  if (this->fOnlyOwnProperties == false) {
    uVar2 = RecyclableObjectWalker::GetChildrenCount(&this->super_RecyclableObjectWalker);
  }
  arrayObj = GetArrayObject(this);
  uVar3 = GetItemCount(this,arrayObj);
  return uVar3 + uVar2;
}

Assistant:

uint32 RecyclableArrayWalker::GetChildrenCount()
    {
        if (Js::JavascriptArray::IsNonES5Array(instance) || Js::VarIs<Js::ES5Array>(instance))
        {
            uint32 count = (!fOnlyOwnProperties ? RecyclableObjectWalker::GetChildrenCount() : 0);

            Js::JavascriptArray* arrayObj = GetArrayObject();

            return GetItemCount(arrayObj) + count;
        }

        return 0;
    }